

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ValueFlag<int,_args::ValueReader<int>_>::ParseValue
          (ValueFlag<int,_args::ValueReader<int>_> *this,string *value_)

{
  int *in_stack_00000358;
  string *in_stack_00000360;
  string *in_stack_00000368;
  ValueReader<int> *in_stack_00000370;
  
  ValueReader<int>::operator()
            (in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }